

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_> __thiscall
enact::Parser::expectTypenamePrecParametric(Parser *this,string *msg,bool emptyAllowed)

{
  bool bVar1;
  unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_> local_b0;
  allocator<char> local_a1;
  string local_a0;
  allocator<char> local_79;
  string local_78 [32];
  undefined1 local_58 [16];
  vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
  parameterTypenames;
  bool emptyAllowed_local;
  string *msg_local;
  Parser *this_local;
  unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_> *typename_;
  
  expectTypenamePrecPrimary(this,msg,emptyAllowed);
  bVar1 = consume((Parser *)msg,LEFT_SQUARE);
  if (bVar1) {
    std::
    vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
    ::vector((vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
              *)(local_58 + 8));
    do {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_78,"Expected typename parameters after \'[\'.",&local_79);
      expectTypename((Parser *)local_58,msg,SUB81(local_78,0));
      std::
      vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
      ::push_back((vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
                   *)(local_58 + 8),(value_type *)local_58);
      std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>::
      ~unique_ptr((unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_> *)
                  local_58);
      std::__cxx11::string::~string(local_78);
      std::allocator<char>::~allocator(&local_79);
      bVar1 = consume((Parser *)msg,COMMA);
    } while (bVar1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a0,"Expected \']\' after typename parameters.",&local_a1);
    expect((Parser *)msg,RIGHT_SQUARE,&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::allocator<char>::~allocator(&local_a1);
    std::
    make_unique<enact::ParametricTypename,std::unique_ptr<enact::Typename_const,std::default_delete<enact::Typename_const>>,std::vector<std::unique_ptr<enact::Typename_const,std::default_delete<enact::Typename_const>>,std::allocator<std::unique_ptr<enact::Typename_const,std::default_delete<enact::Typename_const>>>>>
              (&local_b0,
               (vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
                *)this);
    std::unique_ptr<enact::Typename_const,std::default_delete<enact::Typename_const>>::operator=
              ((unique_ptr<enact::Typename_const,std::default_delete<enact::Typename_const>> *)this,
               (unique_ptr<enact::ParametricTypename,_std::default_delete<enact::ParametricTypename>_>
                *)&local_b0);
    std::unique_ptr<enact::ParametricTypename,_std::default_delete<enact::ParametricTypename>_>::
    ~unique_ptr((unique_ptr<enact::ParametricTypename,_std::default_delete<enact::ParametricTypename>_>
                 *)&local_b0);
    std::
    vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
    ::~vector((vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
               *)(local_58 + 8));
  }
  return (__uniq_ptr_data<const_enact::Typename,_std::default_delete<const_enact::Typename>,_true,_true>
          )(__uniq_ptr_data<const_enact::Typename,_std::default_delete<const_enact::Typename>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<const Typename> Parser::expectTypenamePrecParametric(const std::string &msg, bool emptyAllowed) {
        std::unique_ptr<const Typename> typename_ = expectTypenamePrecPrimary(msg, emptyAllowed);

        if (consume(TokenType::LEFT_SQUARE)) {
            std::vector<std::unique_ptr<const Typename>> parameterTypenames;

            do {
                parameterTypenames.push_back(expectTypename("Expected typename parameters after '['."));
            } while (consume(TokenType::COMMA));
            expect(TokenType::RIGHT_SQUARE, "Expected ']' after typename parameters.");

            typename_ = std::make_unique<ParametricTypename>(std::move(typename_), std::move(parameterTypenames));
        }

        return typename_;
    }